

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateProto2NamespaceEnumSpecializations
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  pointer puVar2;
  ulong uVar3;
  size_type __dnew;
  NamespaceOpener proto_ns;
  Formatter format;
  size_type local_a0;
  string local_98;
  NamespaceOpener local_78;
  Formatter local_58;
  
  local_58.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_58.vars_._M_t,&(this->variables_)._M_t);
  bVar1 = HasEnumDefinitions(this->file_);
  if (bVar1) {
    Formatter::operator()<>(&local_58,"\n");
    local_a0 = 0x15;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_a0);
    local_98.field_2._M_allocated_capacity = local_a0;
    builtin_strncpy(local_98._M_dataplus._M_p,"PROTOBUF_NAMESPACE_ID",0x15);
    local_98._M_string_length = local_a0;
    local_98._M_dataplus._M_p[local_a0] = '\0';
    NamespaceOpener::NamespaceOpener(&local_78,&local_98,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    Formatter::operator()<>(&local_58,"\n");
    puVar2 = (this->enum_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->enum_generators_).
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
      uVar3 = 0;
      do {
        EnumGenerator::GenerateGetEnumDescriptorSpecializations
                  (puVar2[uVar3]._M_t.
                   super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
                   .super__Head_base<0UL,_google::protobuf::compiler::cpp::EnumGenerator_*,_false>.
                   _M_head_impl,printer);
        uVar3 = uVar3 + 1;
        puVar2 = (this->enum_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar3 < (ulong)((long)(this->enum_generators_).
                                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3)
              );
    }
    Formatter::operator()<>(&local_58,"\n");
    NamespaceOpener::~NamespaceOpener(&local_78);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_58.vars_._M_t);
  return;
}

Assistant:

void FileGenerator::GenerateProto2NamespaceEnumSpecializations(
    io::Printer* printer) {
  Formatter format(printer, variables_);
  // Emit GetEnumDescriptor specializations into google::protobuf namespace:
  if (HasEnumDefinitions(file_)) {
    format("\n");
    {
      NamespaceOpener proto_ns(ProtobufNamespace(options_), format);
      format("\n");
      for (int i = 0; i < enum_generators_.size(); i++) {
        enum_generators_[i]->GenerateGetEnumDescriptorSpecializations(printer);
      }
      format("\n");
    }
  }
}